

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O3

long dprintf_DollarString(char *input,char **end)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  byte *pbVar5;
  
  iVar2 = Curl_isdigit((uint)(byte)*input);
  uVar4 = 0;
  if (iVar2 != 0) {
    pbVar1 = (byte *)(input + 1);
    do {
      pbVar5 = pbVar1;
      uVar3 = ((int)(char)pbVar5[-1] + (int)uVar4 * 10) - 0x30;
      uVar4 = (ulong)uVar3;
      iVar2 = Curl_isdigit((uint)*pbVar5);
      pbVar1 = pbVar5 + 1;
    } while (iVar2 != 0);
    if ((uVar3 == 0) || (*pbVar5 != 0x24)) {
      uVar4 = 0;
    }
    else {
      *end = (char *)(pbVar5 + 1);
      uVar4 = (ulong)(int)uVar3;
    }
  }
  return uVar4;
}

Assistant:

static long dprintf_DollarString(char *input, char **end)
{
  int number = 0;
  while(ISDIGIT(*input)) {
    number *= 10;
    number += *input-'0';
    input++;
  }
  if(number && ('$'==*input++)) {
    *end = input;
    return number;
  }
  return 0;
}